

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O3

void AddCubesToStartingCover(Vec_Wec_t *vEsop)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  drow *pdVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  int *pVars;
  int *pVarValues;
  Cube *pC;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar14;
  int iVar15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  long lVar17;
  
  iVar15 = g_CoverInfo.nVarsIn;
  lVar11 = (long)g_CoverInfo.nVarsIn;
  pVars = (int *)malloc(lVar11 * 4);
  pVarValues = (int *)malloc(lVar11 * 4);
  auVar6 = _DAT_008403e0;
  if (0 < lVar11) {
    lVar11 = lVar11 + -1;
    auVar12._8_4_ = (int)lVar11;
    auVar12._0_8_ = lVar11;
    auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_008403e0;
    auVar19 = _DAT_008403d0;
    do {
      bVar5 = auVar12._0_4_ < SUB164(auVar19 ^ auVar6,0);
      iVar14 = auVar12._4_4_;
      iVar20 = SUB164(auVar19 ^ auVar6,4);
      if ((bool)(~(iVar14 < iVar20 || iVar20 == iVar14 && bVar5) & 1)) {
        pVars[uVar9] = (int)uVar9;
      }
      if (iVar14 >= iVar20 && (iVar20 != iVar14 || !bVar5)) {
        pVars[uVar9 + 1] = (int)uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar11 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar11 + 2;
    } while ((iVar15 + 1U & 0xfffffffe) != uVar9);
  }
  g_CoverInfo.nLiteralsBefore = 0;
  if (0 < vEsop->nSize) {
    lVar11 = 0;
    do {
      auVar6 = _DAT_008403e0;
      pVVar2 = vEsop->pArray;
      if (pVVar2[lVar11].nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
      }
      piVar3 = pVVar2[lVar11].pArray;
      uVar8 = pVVar2[lVar11].nSize - 1;
      pVVar2[lVar11].nSize = uVar8;
      uVar1 = piVar3[uVar8];
      if (0 < (long)g_CoverInfo.nVarsIn) {
        uVar8 = g_CoverInfo.nVarsIn + 3;
        lVar10 = (long)g_CoverInfo.nVarsIn + -1;
        auVar13._8_4_ = (int)lVar10;
        auVar13._0_8_ = lVar10;
        auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar13 = auVar13 ^ auVar6;
        lVar10 = 0;
        auVar16 = _DAT_008403d0;
        auVar18 = _DAT_008403c0;
        do {
          auVar19 = auVar16 ^ auVar6;
          iVar15 = auVar13._4_4_;
          if ((bool)(~(auVar19._4_4_ == iVar15 && auVar13._0_4_ < auVar19._0_4_ ||
                      iVar15 < auVar19._4_4_) & 1)) {
            *(undefined4 *)((long)pVarValues + lVar10) = 3;
          }
          if ((auVar19._12_4_ != auVar13._12_4_ || auVar19._8_4_ <= auVar13._8_4_) &&
              auVar19._12_4_ <= auVar13._12_4_) {
            *(undefined4 *)((long)pVarValues + lVar10 + 4) = 3;
          }
          iVar14 = SUB164(auVar18 ^ auVar6,4);
          if (iVar14 <= iVar15 && (iVar14 != iVar15 || SUB164(auVar18 ^ auVar6,0) <= auVar13._0_4_))
          {
            *(undefined4 *)((long)pVarValues + lVar10 + 8) = 3;
            *(undefined4 *)((long)pVarValues + lVar10 + 0xc) = 3;
          }
          lVar17 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 4;
          auVar16._8_8_ = lVar17 + 4;
          lVar17 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 4;
          auVar18._8_8_ = lVar17 + 4;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)(uVar8 >> 2) << 4 != lVar10);
        uVar8 = pVVar2[lVar11].nSize;
      }
      if (0 < (int)uVar8) {
        lVar10 = 0;
        do {
          uVar8 = piVar3[lVar10];
          if ((int)uVar8 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf3,"int Abc_LitIsCompl(int)");
          }
          pVarValues[uVar8 >> 1] = 2 - (uVar8 & 1);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar2[lVar11].nSize);
      }
      pC = GetFreeCube();
      pdVar4 = pC->pCubeDataIn;
      if (*pdVar4 != 0) {
        if (0 < g_CoverInfo.nWordsIn) {
          lVar10 = 0;
          do {
            pdVar4[lVar10] = 0;
            lVar10 = lVar10 + 1;
          } while (lVar10 < g_CoverInfo.nWordsIn);
        }
        if (0 < g_CoverInfo.nWordsOut) {
          pdVar4 = pC->pCubeDataOut;
          lVar10 = 0;
          do {
            pdVar4[lVar10] = 0;
            lVar10 = lVar10 + 1;
          } while (lVar10 < g_CoverInfo.nWordsOut);
        }
      }
      InsertVarsWithoutClearing(pC,pVars,g_CoverInfo.nVarsIn,pVarValues,~uVar1);
      pC->a = (short)pVVar2[lVar11].nSize;
      pC->z = 1;
      iVar15 = g_CoverInfo.cIDs + 1;
      bVar7 = (byte)g_CoverInfo.cIDs;
      g_CoverInfo.cIDs = iVar15;
      pC->ID = bVar7;
      if (iVar15 == 0x100) {
        g_CoverInfo.cIDs = 1;
      }
      CheckForCloseCubes(pC,1);
      g_CoverInfo.nLiteralsBefore = g_CoverInfo.nLiteralsBefore + pVVar2[lVar11].nSize;
      lVar11 = lVar11 + 1;
    } while (lVar11 < vEsop->nSize);
  }
  if (pVars != (int *)0x0) {
    free(pVars);
  }
  if (pVarValues != (int *)0x0) {
    free(pVarValues);
  }
  if (g_CoverInfo.nCubesFree + g_CoverInfo.nCubesInUse != g_CoverInfo.nCubesAlloc) {
    __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exor.c"
                  ,0x27f,"void AddCubesToStartingCover(Vec_Wec_t *)");
  }
  return;
}

Assistant:

void AddCubesToStartingCover( Vec_Wec_t * vEsop )
{
    Vec_Int_t * vCube;
    Cube * pNew;
    int * s_Level2Var;
    int * s_LevelValues;
    int c, i, k, Lit, Out;

    s_Level2Var = ABC_ALLOC( int, g_CoverInfo.nVarsIn );
    s_LevelValues = ABC_ALLOC( int, g_CoverInfo.nVarsIn );

    for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
        s_Level2Var[i] = i;

    g_CoverInfo.nLiteralsBefore = 0;
    Vec_WecForEachLevel( vEsop, vCube, c )
    {
        // get the output of this cube
        Out = -Vec_IntPop(vCube) - 1;

        // fill in the cube with blanks
        for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
            s_LevelValues[i] = VAR_ABS;
        Vec_IntForEachEntry( vCube, Lit, k )
        {
            if ( Abc_LitIsCompl(Lit) )
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_NEG;
            else
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_POS;
        }

        // get the new cube
        pNew = GetFreeCube();
        // consider the need to clear the cube
        if ( pNew->pCubeDataIn[0] ) // this is a recycled cube
        {
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                pNew->pCubeDataIn[i] = 0;
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                pNew->pCubeDataOut[i] = 0;
        }

        InsertVarsWithoutClearing( pNew, s_Level2Var, g_CoverInfo.nVarsIn, s_LevelValues, Out );
        // set literal counts
        pNew->a = Vec_IntSize(vCube);
        pNew->z = 1;
        // set the ID
        pNew->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // add this cube to storage
        CheckForCloseCubes( pNew, 1 );

        g_CoverInfo.nLiteralsBefore += Vec_IntSize(vCube);
    }
    ABC_FREE( s_Level2Var );
    ABC_FREE( s_LevelValues );

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );
}